

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* prmon::cmd_pipe_output
            (pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *cmdargs)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  pointer pbVar2;
  char *pcVar3;
  int iVar4;
  __pid_t __pid;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  char **__argv;
  int *piVar7;
  ostream *poVar8;
  long lVar9;
  pointer pbVar10;
  long lVar11;
  int fd [2];
  int status;
  string output;
  char buffer [100];
  int local_ec;
  int local_e8;
  int local_e4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  value_type local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  char acStack_99 [105];
  
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->first = 0;
  pvVar1 = &__return_storage_ptr__->second;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(pvVar1,&local_b8);
  iVar4 = pipe(&local_ec);
  if (iVar4 == -1) {
    __return_storage_ptr__->first = 2;
  }
  else {
    __pid = fork();
    if (__pid < 0) {
      __return_storage_ptr__->first = 3;
    }
    else {
      local_e0 = pvVar1;
      if (__pid == 0) {
        close(local_ec);
        dup2(local_e8,1);
        dup2(local_e8,2);
        pbVar10 = (cmdargs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = (cmdargs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pcVar3 = (pbVar10->_M_dataplus)._M_p;
        lVar11 = (long)pbVar2 - (long)pbVar10;
        __argv = (char **)malloc((lVar11 >> 2) + 8);
        if (__argv != (char **)0x0) {
          lVar11 = lVar11 >> 5;
          if (pbVar2 != pbVar10) {
            lVar9 = 0;
            do {
              __argv[lVar9] = (pbVar10->_M_dataplus)._M_p;
              lVar9 = lVar9 + 1;
              pbVar10 = pbVar10 + 1;
            } while (lVar11 + (ulong)(lVar11 == 0) != lVar9);
          }
          __argv[lVar11] = (char *)0x0;
          execvp(pcVar3,__argv);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Exec ERROR: ",0xc);
          piVar7 = __errno_location();
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,*piVar7);
          std::endl<char,std::char_traits<char>>(poVar8);
          free(__argv);
        }
        exit(1);
      }
      close(local_e8);
      __stream = fdopen(local_ec,"r");
      pcVar3 = acStack_99 + 1;
      pcVar5 = fgets(pcVar3,100,__stream);
      if (pcVar5 != (char *)0x0) {
        do {
          sVar6 = strlen(pcVar3);
          if ((sVar6 == 0) || (pcVar3[sVar6 - 1] != '\n')) {
            std::__cxx11::string::append((char *)&local_d8);
          }
          else {
            acStack_99[sVar6] = '\0';
            std::__cxx11::string::append((char *)&local_d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_b8,&local_d8);
            local_d8._M_string_length = 0;
            *local_d8._M_dataplus._M_p = '\0';
          }
          pcVar5 = fgets(pcVar3,100,__stream);
        } while (pcVar5 != (char *)0x0);
      }
      pvVar1 = local_e0;
      if (local_d8._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_b8,&local_d8);
      }
      fclose(__stream);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(pvVar1,&local_b8);
      local_e4 = 0;
      waitpid(__pid,&local_e4,0);
      if (local_e4 != 0) {
        __return_storage_ptr__->first = 1;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

const std::pair<int, std::vector<std::string>> prmon::cmd_pipe_output(
    const std::vector<std::string> cmdargs) {
  std::vector<std::string> split_output{};
  std::string output;
  std::pair<int, std::vector<std::string>> ret{0, split_output};

  int fd[2];
  if (pipe(fd) == -1) {
    // Pipe failed
    ret.first = 2;
    return ret;
  }

  pid_t p;
  p = fork();
  if (p < 0) {
    // Fork failed
    ret.first = 3;
    return ret;
  }

  if (p > 0) {
    // Parent
    close(fd[1]);
  } else {
    // Child
    close(fd[0]);
    dup2(fd[1], STDOUT_FILENO);
    dup2(fd[1], STDERR_FILENO);

    // Construct the c-ish char*s needed for execvp
    const char* cmd = cmdargs[0].c_str();
    char** argv = (char**)malloc((cmdargs.size() + 1) * sizeof(char*));
    if (!argv) exit(EXIT_FAILURE);
    for (size_t i = 0; i < cmdargs.size(); ++i) {
      argv[i] = (char*)cmdargs[i].c_str();
    }
    argv[cmdargs.size()] = NULL;

    execvp(cmd, argv);
    // If we got here then something went wrong and exec failed
    // need to signal this back to our parent
    std::cerr << "Exec ERROR: " << errno << std::endl;
    free(argv);
    exit(EXIT_FAILURE);
    // Child
  }

  // Read the output from the executed command and collect
  // it into the output vector of strings
  const size_t buf_len = 100;
  char buffer[buf_len];
  FILE* inp = fdopen(fd[0], "r");
  while (fgets(buffer, buf_len, inp) != NULL) {
    // fgets stops on newlines, so use that to help split
    // the output into the vector of strings
    if ((strlen(buffer) > 0) && (buffer[strlen(buffer) - 1] == '\n')) {
      buffer[strlen(buffer) - 1] = '\0';
      output.append(buffer);
      split_output.push_back(output);
      output.clear();
    } else {
      output.append(buffer);
    }
  }
  if (!output.empty()) {
    split_output.push_back(output);
  }
  fclose(inp);
  ret.second = split_output;

  int status = 0;
  waitpid(p, &status, 0);
  if (status) {
    // Something went wrong in childland...
    ret.first = 1;
    return ret;
  }

  return ret;
}